

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void cf_sha256_digest_final(cf_sha256_context *ctx,uint8_t *hash)

{
  long lVar1;
  uint8_t local_38 [8];
  uint8_t buf [8];
  size_t padbytes;
  uint64_t digested_bits;
  uint64_t digested_bytes;
  uint8_t *hash_local;
  cf_sha256_context *ctx_local;
  
  lVar1 = (ulong)ctx->blocks * 0x40 + ctx->npartial;
  buf = (uint8_t  [8])(0x40 - (lVar1 + 8U & 0x3f));
  cf_blockwise_acc_pad
            (ctx->partial,&ctx->npartial,0x40,0x80,'\0','\0',(size_t)buf,sha256_update_block,ctx);
  write64_be(lVar1 * 8,local_38);
  cf_sha256_update(ctx,local_38,8);
  if (ctx->npartial != 0) {
    abort();
  }
  write32_be(ctx->H[0],hash);
  write32_be(ctx->H[1],hash + 4);
  write32_be(ctx->H[2],hash + 8);
  write32_be(ctx->H[3],hash + 0xc);
  write32_be(ctx->H[4],hash + 0x10);
  write32_be(ctx->H[5],hash + 0x14);
  write32_be(ctx->H[6],hash + 0x18);
  write32_be(ctx->H[7],hash + 0x1c);
  memset(ctx,0,0x70);
  return;
}

Assistant:

void cf_sha256_digest_final(cf_sha256_context *ctx, uint8_t hash[CF_SHA256_HASHSZ])
{
  uint64_t digested_bytes = ctx->blocks;
  digested_bytes = digested_bytes * CF_SHA256_BLOCKSZ + ctx->npartial;
  uint64_t digested_bits = digested_bytes * 8;

  size_t padbytes = CF_SHA256_BLOCKSZ - ((digested_bytes + 8) % CF_SHA256_BLOCKSZ);

  /* Hash 0x80 00 ... block first. */
  cf_blockwise_acc_pad(ctx->partial, &ctx->npartial, sizeof ctx->partial,
                       0x80, 0x00, 0x00, padbytes,
                       sha256_update_block, ctx);

  /* Now hash length. */
  uint8_t buf[8];
  write64_be(digested_bits, buf);
  cf_sha256_update(ctx, buf, 8);

  /* We ought to have got our padding calculation right! */
  assert(ctx->npartial == 0);

  write32_be(ctx->H[0], hash + 0);
  write32_be(ctx->H[1], hash + 4);
  write32_be(ctx->H[2], hash + 8);
  write32_be(ctx->H[3], hash + 12);
  write32_be(ctx->H[4], hash + 16);
  write32_be(ctx->H[5], hash + 20);
  write32_be(ctx->H[6], hash + 24);
  write32_be(ctx->H[7], hash + 28);
  
  memset(ctx, 0, sizeof *ctx);
}